

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_clcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t unaff_retaddr;
  uint32_t cc;
  uint8_t pad;
  uint64_t src3;
  uint64_t src3len;
  uint64_t src1;
  uint64_t src1len;
  uintptr_t ra;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  src1len = unaff_retaddr;
  ra._0_4_ = r2;
  ra._4_4_ = r1;
  _r2_local = env;
  src1 = extract64(env->regs[r1 + 1],0,0x18);
  src3len = get_address(_r2_local,ra._4_4_);
  src3 = extract64(_r2_local->regs[(uint32_t)ra + 1],0,0x18);
  _cc = get_address(_r2_local,(uint32_t)ra);
  uVar1 = do_clcl(_r2_local,&src3len,&src1,(uint64_t *)&cc,&src3,
                  (ushort)(byte)(_r2_local->regs[(uint32_t)ra + 1] >> 0x18),0xffffffffffffffff,1,
                  src1len);
  uVar2 = deposit64(_r2_local->regs[ra._4_4_ + 1],0,0x18,src1);
  _r2_local->regs[ra._4_4_ + 1] = uVar2;
  uVar2 = deposit64(_r2_local->regs[(uint32_t)ra + 1],0,0x18,src3);
  _r2_local->regs[(uint32_t)ra + 1] = uVar2;
  set_address(_r2_local,ra._4_4_,src3len);
  set_address(_r2_local,(uint32_t)ra,_cc);
  return uVar1;
}

Assistant:

uint32_t HELPER(clcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = extract64(env->regs[r1 + 1], 0, 24);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = extract64(env->regs[r2 + 1], 0, 24);
    uint64_t src3 = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    uint32_t cc;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, -1, 1, ra);

    env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, src1len);
    env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, src3len);
    set_address(env, r1, src1);
    set_address(env, r2, src3);

    return cc;
}